

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week7-app4.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *local_50 [2];
  long local_40 [2];
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"hello","");
  local_30 = local_20;
  local_20[0] = 0;
  local_28 = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    type_display< remove_modifiers<const int&>::type >();

    func2(5);
    func2(string("hello"));

    using K = decltype( func2(5) ); // unevaluated context
//    auto td = type_display< K >();

    auto v = std::vector<int>{};

    return 0;
}